

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::avgrUInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  (__return_storage_ptr__->field_0).i32 = (iVar2 + iVar1 + 1) / 2;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::avgrUInt(const Literal& other) const {
  return Literal((geti32() + other.geti32() + 1) / 2);
}